

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

bool __thiscall toml::Value::ValueConverter<bool>::to(ValueConverter<bool> *this,Value *v)

{
  char *local_10;
  char *local_8;
  
  if (v->type_ == BOOL_TYPE) {
    return (v->field_1).bool_;
  }
  local_8 = typeToString(v->type_);
  local_10 = "bool";
  failwith<char_const(&)[27],char_const*,char_const(&)[6],char_const*,char_const(&)[15]>
            ((char (*) [27])"type error: this value is ",&local_8,(char (*) [6])" but ",&local_10,
             (char (*) [15])" was requested");
}

Assistant:

Type type() const { return type_; }